

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_expression.cpp
# Opt level: O2

ExpEmit __thiscall FxForLoop::Emit(FxForLoop *this,VMFunctionBuilder *build)

{
  FxExpression *pFVar1;
  FxJumpStatement *pFVar2;
  ExpEmit EVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  uint i;
  size_t unaff_R12;
  ulong uVar9;
  ExpEmit iter;
  ExpEmit code;
  ExpEmit cond;
  ExpEmit init;
  
  pFVar1 = this->Condition;
  if (pFVar1 != (FxExpression *)0x0) {
    if (pFVar1->ValueType == (PType *)TypeBool) {
      iVar4 = (*pFVar1->_vptr_FxExpression[3])();
      if (((char)iVar4 == '\0') || (this->Condition == (FxExpression *)0x0)) goto LAB_005d8d5b;
    }
    __assert_fail("(Condition && Condition->ValueType == TypeBool && !Condition->isConstant()) || Condition == nullptr"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/thingdef/thingdef_expression.cpp"
                  ,0x1213,"virtual ExpEmit FxForLoop::Emit(VMFunctionBuilder *)");
  }
LAB_005d8d5b:
  pFVar1 = this->Init;
  if (pFVar1 != (FxExpression *)0x0) {
    iVar4 = (*pFVar1->_vptr_FxExpression[7])(pFVar1,build);
    init._0_2_ = SUB42(iVar4,0);
    init._2_1_ = SUB41((uint)iVar4 >> 0x10,0);
    ExpEmit::Free(&init,build);
  }
  sVar6 = VMFunctionBuilder::GetAddress(build);
  pFVar1 = this->Condition;
  if (pFVar1 != (FxExpression *)0x0) {
    uVar5 = (*pFVar1->_vptr_FxExpression[7])(pFVar1,build);
    cond._0_2_ = SUB42(uVar5,0);
    cond._2_1_ = SUB41(uVar5 >> 0x10,0);
    VMFunctionBuilder::Emit(build,0x36,uVar5 & 0xff,0);
    ExpEmit::Free(&cond,build);
    unaff_R12 = VMFunctionBuilder::Emit(build,0x37,0);
  }
  pFVar1 = this->Code;
  if (pFVar1 != (FxExpression *)0x0) {
    iVar4 = (*pFVar1->_vptr_FxExpression[7])(pFVar1,build);
    code._0_2_ = SUB42(iVar4,0);
    code._2_1_ = SUB41((uint)iVar4 >> 0x10,0);
    ExpEmit::Free(&code,build);
  }
  sVar7 = VMFunctionBuilder::GetAddress(build);
  pFVar1 = this->Iteration;
  if (pFVar1 != (FxExpression *)0x0) {
    iVar4 = (*pFVar1->_vptr_FxExpression[7])(pFVar1,build);
    iter._0_2_ = SUB42(iVar4,0);
    iter._2_1_ = SUB41((uint)iVar4 >> 0x10,0);
    ExpEmit::Free(&iter,build);
  }
  sVar8 = VMFunctionBuilder::Emit(build,0x37,0);
  VMFunctionBuilder::Backpatch(build,sVar8,sVar6);
  sVar6 = VMFunctionBuilder::GetAddress(build);
  if (this->Condition != (FxExpression *)0x0) {
    VMFunctionBuilder::Backpatch(build,unaff_R12,sVar6);
  }
  for (uVar9 = 0; uVar9 < (this->super_FxExpression).JumpAddresses.Count; uVar9 = uVar9 + 1) {
    pFVar2 = (this->super_FxExpression).JumpAddresses.Array[uVar9];
    sVar8 = sVar7;
    if (*(int *)&(pFVar2->super_FxExpression).field_0x34 == 0x125) {
      sVar8 = sVar6;
    }
    VMFunctionBuilder::Backpatch(build,pFVar2->Address,sVar8);
  }
  EVar3.RegNum = '\0';
  EVar3.RegType = 0xff;
  EVar3._2_1_ = 0;
  return EVar3;
}

Assistant:

ExpEmit FxForLoop::Emit(VMFunctionBuilder *build)
{
	assert((Condition && Condition->ValueType == TypeBool && !Condition->isConstant()) || Condition == nullptr);

	size_t loopstart, loopend;
	size_t codestart;
	size_t jumpspot;

	// Init statement.
	if (Init != nullptr)
	{
		ExpEmit init = Init->Emit(build);
		init.Free(build);
	}

	// Evaluate the condition and execute/break out of the loop.
	codestart = build->GetAddress();
	if (Condition != nullptr)
	{
		ExpEmit cond = Condition->Emit(build);
		build->Emit(OP_TEST, cond.RegNum, 0);
		cond.Free(build);
		jumpspot = build->Emit(OP_JMP, 0);
	}

	// Execute the loop's content.
	if (Code != nullptr)
	{
		ExpEmit code = Code->Emit(build);
		code.Free(build);
	}

	// Iteration statement.
	loopstart = build->GetAddress();
	if (Iteration != nullptr)
	{
		ExpEmit iter = Iteration->Emit(build);
		iter.Free(build);
	}
	build->Backpatch(build->Emit(OP_JMP, 0), codestart);

	// End of loop.
	loopend = build->GetAddress();
	if (Condition != nullptr)
	{
		build->Backpatch(jumpspot, loopend);
	}

	// Give a proper address to any break/continue statement within this loop.
	for (unsigned int i = 0; i < JumpAddresses.Size(); i++)
	{
		if (JumpAddresses[i]->Token == TK_Break)
		{
			build->Backpatch(JumpAddresses[i]->Address, loopend);
		}
		else
		{ // Continue statement.
			build->Backpatch(JumpAddresses[i]->Address, loopstart);
		}
	}

	return ExpEmit();
}